

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O0

void mzd_addmul_v_s256_30_128(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 (*in_RDX) [32];
  undefined1 (*in_RDI) [16];
  undefined8 uVar11;
  undefined8 uVar12;
  size_t bit;
  undefined8 uVar13;
  word idx_00;
  undefined8 uVar14;
  uint i;
  word256 cval [2];
  word idx;
  block_t *Ablock;
  block_t *vblock;
  block_t *cblock;
  size_t in_stack_fffffffffffff968;
  size_t sVar15;
  word in_stack_fffffffffffff970;
  word wVar16;
  ulong local_540;
  ulong uStack_538;
  ulong uStack_530;
  ulong uStack_528;
  int local_4e4;
  ulong local_4e0;
  ulong uStack_4d8;
  ulong uStack_4d0;
  ulong uStack_4c8;
  undefined1 local_4c0 [32];
  undefined1 (*local_490) [32];
  ulong local_380;
  ulong uStack_378;
  ulong uStack_370;
  ulong uStack_368;
  ulong local_340;
  ulong uStack_338;
  ulong uStack_330;
  ulong uStack_328;
  ulong local_300;
  ulong uStack_2f8;
  ulong uStack_2f0;
  ulong uStack_2e8;
  ulong local_2c0;
  ulong uStack_2b8;
  ulong uStack_2b0;
  ulong uStack_2a8;
  ulong local_280;
  ulong uStack_278;
  ulong uStack_270;
  ulong uStack_268;
  ulong local_240;
  ulong uStack_238;
  ulong uStack_230;
  ulong uStack_228;
  
  auVar10 = *in_RDI;
  auVar2 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0);
  uVar11 = *(undefined8 *)*in_RDX;
  uVar12 = *(undefined8 *)(*in_RDX + 8);
  uVar13 = *(undefined8 *)(*in_RDX + 0x10);
  uVar14 = *(undefined8 *)(*in_RDX + 0x18);
  auVar1 = *in_RDX;
  mm256_compute_mask_2(in_stack_fffffffffffff970,in_stack_fffffffffffff968);
  local_540 = SUB168(ZEXT116(1) * auVar10,0);
  uStack_538 = SUB168(ZEXT116(1) * auVar10,8);
  uStack_530 = auVar2._0_8_;
  uStack_528 = auVar2._8_8_;
  auVar9._8_8_ = uVar12;
  auVar9._0_8_ = uVar11;
  auVar9._16_8_ = uVar13;
  auVar9._24_8_ = uVar14;
  auVar1 = vpand_avx2(auVar1,auVar9);
  local_240 = auVar1._0_8_;
  uStack_238 = auVar1._8_8_;
  uStack_230 = auVar1._16_8_;
  uStack_228 = auVar1._24_8_;
  local_4e0 = local_540 ^ local_240;
  uStack_4d8 = uStack_538 ^ uStack_238;
  uStack_4d0 = uStack_530 ^ uStack_230;
  uStack_4c8 = uStack_528 ^ uStack_228;
  uVar11 = *(undefined8 *)in_RDX[1];
  uVar12 = *(undefined8 *)(in_RDX[1] + 8);
  uVar13 = *(undefined8 *)(in_RDX[1] + 0x10);
  uVar14 = *(undefined8 *)(in_RDX[1] + 0x18);
  auVar9 = in_RDX[1];
  mm256_compute_mask_2(in_stack_fffffffffffff970,in_stack_fffffffffffff968);
  auVar1._8_8_ = uVar12;
  auVar1._0_8_ = uVar11;
  auVar1._16_8_ = uVar13;
  auVar1._24_8_ = uVar14;
  local_4c0 = vpand_avx2(auVar9,auVar1);
  local_490 = in_RDX + 2;
  for (local_4e4 = 0x18; local_4e4 != 0; local_4e4 = local_4e4 + -8) {
    uVar11 = *(undefined8 *)*local_490;
    uVar12 = *(undefined8 *)(*local_490 + 8);
    uVar13 = *(undefined8 *)(*local_490 + 0x10);
    uVar14 = *(undefined8 *)(*local_490 + 0x18);
    auVar1 = *local_490;
    mm256_compute_mask_2(in_stack_fffffffffffff970,in_stack_fffffffffffff968);
    auVar8._8_8_ = uVar12;
    auVar8._0_8_ = uVar11;
    auVar8._16_8_ = uVar13;
    auVar8._24_8_ = uVar14;
    auVar1 = vpand_avx2(auVar1,auVar8);
    local_280 = auVar1._0_8_;
    uStack_278 = auVar1._8_8_;
    uStack_270 = auVar1._16_8_;
    uStack_268 = auVar1._24_8_;
    uVar11 = *(undefined8 *)local_490[1];
    uVar12 = *(undefined8 *)(local_490[1] + 8);
    uVar13 = *(undefined8 *)(local_490[1] + 0x10);
    uVar14 = *(undefined8 *)(local_490[1] + 0x18);
    auVar1 = local_490[1];
    mm256_compute_mask_2(in_stack_fffffffffffff970,in_stack_fffffffffffff968);
    auVar7._8_8_ = uVar12;
    auVar7._0_8_ = uVar11;
    auVar7._16_8_ = uVar13;
    auVar7._24_8_ = uVar14;
    auVar1 = vpand_avx2(auVar1,auVar7);
    local_2c0 = auVar1._0_8_;
    uStack_2b8 = auVar1._8_8_;
    uStack_2b0 = auVar1._16_8_;
    uStack_2a8 = auVar1._24_8_;
    uVar11 = *(undefined8 *)local_490[2];
    uVar12 = *(undefined8 *)(local_490[2] + 8);
    uVar13 = *(undefined8 *)(local_490[2] + 0x10);
    uVar14 = *(undefined8 *)(local_490[2] + 0x18);
    auVar1 = local_490[2];
    mm256_compute_mask_2(in_stack_fffffffffffff970,in_stack_fffffffffffff968);
    auVar6._8_8_ = uVar12;
    auVar6._0_8_ = uVar11;
    auVar6._16_8_ = uVar13;
    auVar6._24_8_ = uVar14;
    auVar1 = vpand_avx2(auVar1,auVar6);
    local_300 = auVar1._0_8_;
    uStack_2f8 = auVar1._8_8_;
    uStack_2f0 = auVar1._16_8_;
    uStack_2e8 = auVar1._24_8_;
    local_4e0 = local_4e0 ^ local_280 ^ local_300;
    uStack_4d8 = uStack_4d8 ^ uStack_278 ^ uStack_2f8;
    uStack_4d0 = uStack_4d0 ^ uStack_270 ^ uStack_2f0;
    uStack_4c8 = uStack_4c8 ^ uStack_268 ^ uStack_2e8;
    uVar11 = *(undefined8 *)local_490[3];
    uVar12 = *(undefined8 *)(local_490[3] + 8);
    uVar13 = *(undefined8 *)(local_490[3] + 0x10);
    uVar14 = *(undefined8 *)(local_490[3] + 0x18);
    auVar1 = local_490[3];
    mm256_compute_mask_2(in_stack_fffffffffffff970,in_stack_fffffffffffff968);
    auVar5._8_8_ = uVar12;
    auVar5._0_8_ = uVar11;
    auVar5._16_8_ = uVar13;
    auVar5._24_8_ = uVar14;
    auVar1 = vpand_avx2(auVar1,auVar5);
    local_340 = auVar1._0_8_;
    uStack_338 = auVar1._8_8_;
    uStack_330 = auVar1._16_8_;
    uStack_328 = auVar1._24_8_;
    local_4c0._8_8_ = local_4c0._8_8_ ^ uStack_2b8 ^ uStack_338;
    local_4c0._0_8_ = local_4c0._0_8_ ^ local_2c0 ^ local_340;
    local_4c0._16_8_ = local_4c0._16_8_ ^ uStack_2b0 ^ uStack_330;
    local_4c0._24_8_ = local_4c0._24_8_ ^ uStack_2a8 ^ uStack_328;
    local_490 = local_490 + 4;
  }
  uVar11 = *(undefined8 *)*local_490;
  bit = *(size_t *)(*local_490 + 8);
  idx_00 = *(word *)(*local_490 + 0x10);
  uVar12 = *(undefined8 *)(*local_490 + 0x18);
  uVar13 = uVar11;
  uVar14 = uVar12;
  sVar15 = bit;
  wVar16 = idx_00;
  mm256_compute_mask_2(idx_00,bit);
  auVar4._8_8_ = sVar15;
  auVar4._0_8_ = uVar11;
  auVar4._16_8_ = wVar16;
  auVar4._24_8_ = uVar12;
  auVar3._8_8_ = bit;
  auVar3._0_8_ = uVar13;
  auVar3._16_8_ = idx_00;
  auVar3._24_8_ = uVar14;
  auVar1 = vpand_avx2(auVar4,auVar3);
  local_380 = auVar1._0_8_;
  uStack_378 = auVar1._8_8_;
  uStack_370 = auVar1._16_8_;
  uStack_368 = auVar1._24_8_;
  *(ulong *)*in_RDI =
       local_4e0 ^ local_380 ^ local_4c0._0_8_ ^ uStack_4d0 ^ uStack_370 ^ local_4c0._16_8_;
  *(ulong *)(*in_RDI + 8) =
       uStack_4d8 ^ uStack_378 ^ local_4c0._8_8_ ^ uStack_4c8 ^ uStack_368 ^ local_4c0._24_8_;
  return;
}

Assistant:

ATTR_TARGET_AVX2
void mzd_addmul_v_s256_30_128(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  block_t* cblock       = BLOCK(c, 0);
  const block_t* vblock = CONST_BLOCK(v, 0);
  const block_t* Ablock = CONST_BLOCK(A, 0);
  word idx              = vblock->w64[1] >> 34;

  word256 cval[2];
  cval[0] = mm256_xor_mask(_mm256_setr_m128i(mm128_load(cblock->w64), mm128_zero),
                           mm256_load(Ablock[0].w64), mm256_compute_mask_2(idx, 0));
  cval[1] = mm256_and(mm256_load(Ablock[1].w64), mm256_compute_mask_2(idx, 2));
  idx >>= 4;
  Ablock += 2;

  for (unsigned int i = 24; i; i -= 8, idx >>= 8, Ablock += 4) {
    cval[0] = mm256_xor_mask(cval[0], mm256_load(Ablock[0].w64), mm256_compute_mask_2(idx, 0));
    cval[1] = mm256_xor_mask(cval[1], mm256_load(Ablock[1].w64), mm256_compute_mask_2(idx, 2));
    cval[0] = mm256_xor_mask(cval[0], mm256_load(Ablock[2].w64), mm256_compute_mask_2(idx, 4));
    cval[1] = mm256_xor_mask(cval[1], mm256_load(Ablock[3].w64), mm256_compute_mask_2(idx, 6));
  }
  cval[0] = mm256_xor_mask(cval[0], mm256_load(Ablock[0].w64), mm256_compute_mask_2(idx, 0));

  cval[0] = mm256_xor(cval[0], cval[1]);
  mm128_store(cblock->w64, mm128_xor(_mm256_extractf128_si256(cval[0], 0),
                                     _mm256_extractf128_si256(cval[0], 1)));
}